

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signaler.cpp
# Opt level: O1

ssize_t __thiscall
zmq::signaler_t::send(signaler_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  __pid_t _Var2;
  undefined4 extraout_var;
  ssize_t sVar3;
  int *piVar4;
  char *errmsg_;
  ssize_t extraout_RAX;
  uint64_t inc;
  
  iVar1 = this->pid;
  _Var2 = getpid();
  sVar3 = CONCAT44(extraout_var,_Var2);
  if (iVar1 == _Var2) {
    inc = 1;
    sVar3 = ::write(this->_w,&inc,8);
    if (sVar3 != 8) {
      piVar4 = __errno_location();
      errmsg_ = strerror(*piVar4);
      fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/signaler.cpp"
              ,0xb8);
      fflush(_stderr);
      zmq_abort(errmsg_);
      sVar3 = extraout_RAX;
    }
  }
  return sVar3;
}

Assistant:

void zmq::signaler_t::send ()
{
#if defined HAVE_FORK
    if (unlikely (pid != getpid ())) {
        //printf("Child process %d signaler_t::send returning without sending #1\n", getpid());
        return; // do not send anything in forked child context
    }
#endif
#if defined ZMQ_HAVE_EVENTFD
    const uint64_t inc = 1;
    ssize_t sz = write (_w, &inc, sizeof (inc));
    errno_assert (sz == sizeof (inc));
#elif defined ZMQ_HAVE_WINDOWS
    const char dummy = 0;
    int nbytes;
    do {
        nbytes = ::send (_w, &dummy, sizeof (dummy), 0);
        wsa_assert (nbytes != SOCKET_ERROR);
        // wsa_assert does not abort on WSAEWOULDBLOCK. If we get this, we retry.
    } while (nbytes == SOCKET_ERROR);
    // Given the small size of dummy (should be 1) expect that send was able to send everything.
    zmq_assert (nbytes == sizeof (dummy));
#elif defined ZMQ_HAVE_VXWORKS
    unsigned char dummy = 0;
    while (true) {
        ssize_t nbytes = ::send (_w, (char *) &dummy, sizeof (dummy), 0);
        if (unlikely (nbytes == -1 && errno == EINTR))
            continue;
#if defined(HAVE_FORK)
        if (unlikely (pid != getpid ())) {
            //printf("Child process %d signaler_t::send returning without sending #2\n", getpid());
            errno = EINTR;
            break;
        }
#endif
        zmq_assert (nbytes == sizeof dummy);
        break;
    }
#else
    unsigned char dummy = 0;
    while (true) {
        ssize_t nbytes = ::send (_w, &dummy, sizeof (dummy), 0);
        if (unlikely (nbytes == -1 && errno == EINTR))
            continue;
#if defined(HAVE_FORK)
        if (unlikely (pid != getpid ())) {
            //printf("Child process %d signaler_t::send returning without sending #2\n", getpid());
            errno = EINTR;
            break;
        }
#endif
        zmq_assert (nbytes == sizeof dummy);
        break;
    }
#endif
}